

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserPOMDPFormat_Spirit.h
# Opt level: O2

void __thiscall
POMDPFormatParsing::ParserPOMDPFormat_Spirit::ProcessStartStateList::ProcessList
          (ProcessStartStateList *this)

{
  ParserPOMDPFormat_Spirit *pPVar1;
  uint *puVar2;
  pointer puVar3;
  undefined1 auVar4 [16];
  size_type __n;
  StateDistributionVector *this_00;
  uint *puVar5;
  long lVar6;
  long lVar7;
  undefined8 extraout_XMM0_Qa;
  undefined1 extraout_var [56];
  allocator_type local_59;
  vector<double,_std::allocator<double>_> init_probs;
  double u_prob;
  value_type_conflict3 local_30;
  _Vector_base<double,_std::allocator<double>_> local_28;
  undefined1 auVar8 [64];
  
  __n = (**(code **)(*(long *)&(this->_m_po->_m_decPOMDPDiscrete->super_DecPOMDPDiscrete).
                               super_MultiAgentDecisionProcessDiscrete.
                               super_MultiAgentDecisionProcess + 0x30))();
  auVar8._8_56_ = extraout_var;
  auVar8._0_8_ = extraout_XMM0_Qa;
  pPVar1 = this->_m_po;
  lVar6 = (long)(pPVar1->_m_startStateListSI).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pPVar1->_m_startStateListSI).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
  lVar7 = __n - lVar6;
  if (pPVar1->_m_startStateListExclude == false) {
    lVar7 = lVar6;
  }
  init_probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  auVar4 = vcvtusi2sd_avx512f(auVar8._0_16_,lVar7);
  u_prob = 1.0 / auVar4._0_8_;
  init_probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  init_probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (pPVar1->_m_startStateListExclude == false) {
    local_30 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_28,__n,&local_30,&local_59);
  }
  else {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_28,__n,&u_prob,
               (allocator_type *)&local_30);
  }
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&init_probs,&local_28);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_28);
  pPVar1 = this->_m_po;
  puVar2 = (pPVar1->_m_startStateListSI).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar5 = (pPVar1->_m_startStateListSI).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start; puVar5 != puVar2; puVar5 = puVar5 + 1) {
    init_probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[*puVar5] =
         (double)((ulong)!(bool)(pPVar1->_m_startStateListExclude & 1) * (long)u_prob);
  }
  this_00 = (StateDistributionVector *)operator_new(0x20);
  StateDistributionVector::StateDistributionVector(this_00,&init_probs);
  MADPComponentDiscreteStates::SetISD
            (&(this->_m_po->_m_decPOMDPDiscrete->super_DecPOMDPDiscrete).
              super_MultiAgentDecisionProcessDiscrete._m_S,(StateDistribution *)this_00);
  if (init_probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_finish !=
      init_probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start) {
    init_probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = init_probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  pPVar1 = this->_m_po;
  puVar3 = (pPVar1->_m_startStateListSI).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((pPVar1->_m_startStateListSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar3) {
    (pPVar1->_m_startStateListSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar3;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&init_probs.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void ProcessList() const
            {
                size_t nrS = _m_po->GetPOMDPDiscrete()->GetNrStates();
                size_t listSize = _m_po->_m_startStateListSI.size();
                size_t nrIncS = (_m_po->_m_startStateListExclude)? nrS - listSize:
                    listSize;
                double u_prob = 1.0 / nrIncS;
                
                std::vector<double> init_probs;
                if(!_m_po->_m_startStateListExclude)
                    //elems in list get uniform prob.
                    init_probs = std::vector<double>(nrS, 0.0);
                else //other elems get uniform prob
                    init_probs = std::vector<double>(nrS, u_prob);

                std::vector<Index>::iterator it = _m_po->_m_startStateListSI.begin();
                std::vector<Index>::iterator last = _m_po->_m_startStateListSI.end();
                while(it != last)
                {
                    init_probs[*it] = _m_po->_m_startStateListExclude? 
                        0.0 : u_prob;
                    it++;
                }
                StateDistributionVector *isd=new StateDistributionVector(init_probs);
                _m_po->GetPOMDPDiscrete()->SetISD(isd);
                init_probs.clear();                
                _m_po->_m_startStateListSI.clear();

            }